

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

size_t MAFSA_automaton_enumerate_int_pair
                 (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
                 MAFSA_letter delim,int *out,size_t sz_out)

{
  size_t in_RCX;
  MAFSA_letter *in_RDX;
  MAFSA_automaton in_RSI;
  MAFSA_letter *in_R8;
  undefined1 in_R9B;
  void *unaff_retaddr;
  MAFSA_automaton_string_handler in_stack_00000008;
  str_inner_params str;
  int iVar1;
  undefined7 in_stack_ffffffffffffffd0;
  
  iVar1 = 0;
  MAFSA_automaton_enumerate_ints
            (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(in_R9B,in_stack_ffffffffffffffd0),'\0',
             unaff_retaddr,in_stack_00000008);
  return (long)iVar1;
}

Assistant:

extern size_t MAFSA_automaton_enumerate_int_pair(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *tmp, size_t sz_tmp, MAFSA_letter delim, int *out, size_t sz_out)
{
    struct str_inner_params str;

    str.delim     = delim;
    str.processed = 0;
    str.data      = out;
    str.data_sz   = sz_out;

    MAFSA_automaton_enumerate_ints(ma, l, sz_l, tmp, sz_tmp,
        delim, &str, MAFSA_str_to_int_pair);

    return str.processed;
}